

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O0

void __thiscall TasGrid::GridGlobal::write<true>(GridGlobal *this,ostream *os)

{
  bool bVar1;
  ostream *os_local;
  GridGlobal *this_local;
  
  IO::writeNumbers<true,(TasGrid::IO::IOPad)1,int,int>
            (os,(this->super_BaseCanonicalGrid).num_dimensions,
             (this->super_BaseCanonicalGrid).num_outputs);
  IO::writeNumbers<true,(TasGrid::IO::IOPad)3,double,double>(os,this->alpha,this->beta);
  IO::writeRule<true>(this->rule,os);
  if (this->rule == rule_customtabulated) {
    CustomTabulated::write<true>(&this->custom,os);
  }
  MultiIndexSet::write<true>(&this->tensors,os);
  MultiIndexSet::write<true>(&this->active_tensors,os);
  bVar1 = ::std::vector<int,_std::allocator<int>_>::empty(&this->active_w);
  if (!bVar1) {
    IO::writeVector<true,(TasGrid::IO::IOPad)3,int>(&this->active_w,os);
  }
  bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
  IO::writeFlag<true,(TasGrid::IO::IOPad)4>((bool)((bVar1 ^ 0xffU) & 1),os);
  bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
  if (!bVar1) {
    MultiIndexSet::write<true>(&(this->super_BaseCanonicalGrid).points,os);
  }
  bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).needed);
  IO::writeFlag<true,(TasGrid::IO::IOPad)4>((bool)((bVar1 ^ 0xffU) & 1),os);
  bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).needed);
  if (!bVar1) {
    MultiIndexSet::write<true>(&(this->super_BaseCanonicalGrid).needed,os);
  }
  IO::writeVector<true,(TasGrid::IO::IOPad)3,int>(&this->max_levels,os);
  if (0 < (this->super_BaseCanonicalGrid).num_outputs) {
    StorageSet::write<true>(&(this->super_BaseCanonicalGrid).values,os);
  }
  bVar1 = MultiIndexSet::empty(&this->updated_tensors);
  IO::writeFlag<true,(TasGrid::IO::IOPad)3>((bool)((bVar1 ^ 0xffU) & 1),os);
  bVar1 = MultiIndexSet::empty(&this->updated_tensors);
  if (!bVar1) {
    MultiIndexSet::write<true>(&this->updated_tensors,os);
    MultiIndexSet::write<true>(&this->updated_active_tensors,os);
    IO::writeVector<true,(TasGrid::IO::IOPad)3,int>(&this->updated_active_w,os);
  }
  return;
}

Assistant:

void GridGlobal::write(std::ostream &os) const{
    if (iomode == mode_ascii){ os << std::scientific; os.precision(17); }
    IO::writeNumbers<iomode, IO::pad_rspace>(os, num_dimensions, num_outputs);
    IO::writeNumbers<iomode, IO::pad_line>(os, alpha, beta);
    IO::writeRule<iomode>(rule, os);
    if (rule == rule_customtabulated)
        custom.write<iomode>(os);

    tensors.write<iomode>(os);
    active_tensors.write<iomode>(os);
    if (!active_w.empty())
        IO::writeVector<iomode, IO::pad_line>(active_w, os);

    IO::writeFlag<iomode, IO::pad_auto>(!points.empty(), os);
    if (!points.empty()) points.write<iomode>(os);
    IO::writeFlag<iomode, IO::pad_auto>(!needed.empty(), os);
    if (!needed.empty()) needed.write<iomode>(os);

    IO::writeVector<iomode, IO::pad_line>(max_levels, os);

    if (num_outputs > 0) values.write<iomode>(os);

    IO::writeFlag<iomode, IO::pad_line>(!updated_tensors.empty(), os);
    if (!updated_tensors.empty()){
        updated_tensors.write<iomode>(os);
        updated_active_tensors.write<iomode>(os);
        IO::writeVector<iomode, IO::pad_line>(updated_active_w, os);
    }
}